

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::ReverseLayerParams::_internal_add_reversedim
          (ReverseLayerParams *this,bool value)

{
  bool local_1;
  
  google::protobuf::RepeatedField<bool>::Add(&this->reversedim_,&local_1);
  return;
}

Assistant:

inline void ReverseLayerParams::_internal_add_reversedim(bool value) {
  reversedim_.Add(value);
}